

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O0

void __thiscall CleanTestCleanTarget::Run(CleanTestCleanTarget *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  TimeStamp TVar6;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  undefined1 local_230 [8];
  string err;
  undefined1 local_208 [8];
  Cleaner cleaner;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  CleanTestCleanTarget *pCStack_10;
  int fail_count;
  CleanTestCleanTarget *this_local;
  
  pCStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_CleanTest).super_StateTestWithBuiltinRules.state_,
              "build in1: cat src1\nbuild out1: cat in1\nbuild in2: cat src2\nbuild out2: cat in2\n"
              ,local_1c);
  iVar4 = local_14;
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  if (iVar4 == iVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"in1",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_40,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"out1",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_a0,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"in2",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_119);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_f0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"out2",&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"",(allocator<char> *)&cleaner.field_0x97);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_140,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&cleaner.field_0x97);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    Cleaner::Cleaner((Cleaner *)local_208,
                     &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_,
                     &(this->super_CleanTest).config_,
                     &(this->super_CleanTest).fs_.super_DiskInterface);
    pTVar1 = g_current_test;
    iVar4 = Cleaner::cleaned_files_count((Cleaner *)local_208);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar4 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean_test.cc"
                       ,0x68,"0 == cleaner.cleaned_files_count()");
    pTVar1 = g_current_test;
    if (bVar2) {
      iVar4 = Cleaner::CleanTarget((Cleaner *)local_208,"out1");
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean_test.cc"
                         ,0x69,"0 == cleaner.CleanTarget(\"out1\")");
      pTVar1 = g_current_test;
      if (bVar2) {
        iVar4 = Cleaner::cleaned_files_count((Cleaner *)local_208);
        testing::Test::Check
                  (pTVar1,iVar4 == 2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean_test.cc"
                   ,0x6a,"2 == cleaner.cleaned_files_count()");
        pTVar1 = g_current_test;
        sVar5 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&(this->super_CleanTest).fs_.files_removed_);
        testing::Test::Check
                  (pTVar1,sVar5 == 2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean_test.cc"
                   ,0x6b,"2u == fs_.files_removed_.size()");
        std::__cxx11::string::string((string *)local_230);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"in1",&local_251);
        TVar6 = VirtualFileSystem::Stat(&(this->super_CleanTest).fs_,&local_250,(string *)local_230)
        ;
        testing::Test::Check
                  (pTVar1,TVar6 == 0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean_test.cc"
                   ,0x6f,"0 == fs_.Stat(\"in1\", &err)");
        std::__cxx11::string::~string((string *)&local_250);
        std::allocator<char>::~allocator(&local_251);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"out1",&local_279);
        TVar6 = VirtualFileSystem::Stat(&(this->super_CleanTest).fs_,&local_278,(string *)local_230)
        ;
        testing::Test::Check
                  (pTVar1,TVar6 == 0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean_test.cc"
                   ,0x70,"0 == fs_.Stat(\"out1\", &err)");
        std::__cxx11::string::~string((string *)&local_278);
        std::allocator<char>::~allocator(&local_279);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"in2",&local_2a1);
        TVar6 = VirtualFileSystem::Stat(&(this->super_CleanTest).fs_,&local_2a0,(string *)local_230)
        ;
        testing::Test::Check
                  (pTVar1,0 < TVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean_test.cc"
                   ,0x71,"0 < fs_.Stat(\"in2\", &err)");
        std::__cxx11::string::~string((string *)&local_2a0);
        std::allocator<char>::~allocator(&local_2a1);
        pTVar1 = g_current_test;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"out2",&local_2c9);
        TVar6 = VirtualFileSystem::Stat(&(this->super_CleanTest).fs_,&local_2c8,(string *)local_230)
        ;
        testing::Test::Check
                  (pTVar1,0 < TVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean_test.cc"
                   ,0x72,"0 < fs_.Stat(\"out2\", &err)");
        std::__cxx11::string::~string((string *)&local_2c8);
        std::allocator<char>::~allocator(&local_2c9);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&(this->super_CleanTest).fs_.files_removed_);
        pTVar1 = g_current_test;
        iVar4 = Cleaner::CleanTarget((Cleaner *)local_208,"out1");
        bVar2 = testing::Test::Check
                          (pTVar1,iVar4 == 0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean_test.cc"
                           ,0x75,"0 == cleaner.CleanTarget(\"out1\")");
        pTVar1 = g_current_test;
        if (bVar2) {
          iVar4 = Cleaner::cleaned_files_count((Cleaner *)local_208);
          testing::Test::Check
                    (pTVar1,iVar4 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean_test.cc"
                     ,0x76,"0 == cleaner.cleaned_files_count()");
          pTVar1 = g_current_test;
          sVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&(this->super_CleanTest).fs_.files_removed_);
          testing::Test::Check
                    (pTVar1,sVar5 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/clean_test.cc"
                     ,0x77,"0u == fs_.files_removed_.size()");
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
        }
        err.field_2._13_3_ = 0;
        err.field_2._M_local_buf[0xc] = !bVar2;
        std::__cxx11::string::~string((string *)local_230);
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        err.field_2._12_4_ = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      err.field_2._12_4_ = 1;
    }
    Cleaner::~Cleaner((Cleaner *)local_208);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanTarget) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build in1: cat src1\n"
"build out1: cat in1\n"
"build in2: cat src2\n"
"build out2: cat in2\n"));
  fs_.Create("in1", "");
  fs_.Create("out1", "");
  fs_.Create("in2", "");
  fs_.Create("out2", "");

  Cleaner cleaner(&state_, config_, &fs_);

  ASSERT_EQ(0, cleaner.cleaned_files_count());
  ASSERT_EQ(0, cleaner.CleanTarget("out1"));
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  EXPECT_EQ(2u, fs_.files_removed_.size());

  // Check they are removed.
  string err;
  EXPECT_EQ(0, fs_.Stat("in1", &err));
  EXPECT_EQ(0, fs_.Stat("out1", &err));
  EXPECT_LT(0, fs_.Stat("in2", &err));
  EXPECT_LT(0, fs_.Stat("out2", &err));
  fs_.files_removed_.clear();

  ASSERT_EQ(0, cleaner.CleanTarget("out1"));
  EXPECT_EQ(0, cleaner.cleaned_files_count());
  EXPECT_EQ(0u, fs_.files_removed_.size());
}